

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

int __thiscall moira::Moira::disassemble(Moira *this,char *str,u32 addr)

{
  LetterCase LVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  code *pcVar6;
  char *pcVar7;
  ulong uVar8;
  long *plVar9;
  u32 pc;
  StrWriter writer;
  u32 local_5c;
  char local_58;
  char local_57 [31];
  char *local_38;
  char *local_30;
  DasmStyle *local_28;
  undefined4 local_20;
  
  local_5c = addr;
  uVar4 = (*this->_vptr_Moira[6])(this,(ulong)addr);
  local_28 = &this->instrStyle;
  local_20 = 8;
  local_58 = '\0';
  uVar8 = (ulong)((uVar4 & 0xffff) << 4);
  pcVar6 = *(code **)((long)this->dasm + uVar8);
  plVar9 = (long *)((long)&this->_vptr_Moira + *(long *)((long)this->dasm + uVar8 + 8));
  if (((ulong)pcVar6 & 1) != 0) {
    pcVar6 = *(code **)(pcVar6 + *plVar9 + -1);
  }
  local_38 = str;
  local_30 = str;
  (*pcVar6)(plVar9,&local_58,&local_5c);
  if (local_58 != '\0') {
    pcVar7 = local_57;
    cVar3 = local_58;
    do {
      pcVar2 = local_30;
      local_30 = local_30 + 1;
      *pcVar2 = cVar3;
      cVar3 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar3 != '\0');
  }
  *local_30 = '\0';
  LVar1 = (this->instrStyle).letterCase;
  pcVar7 = local_38;
  if (LVar1 == UPPER_CASE) {
    for (; pcVar7 < local_30; pcVar7 = pcVar7 + 1) {
      iVar5 = toupper((int)*pcVar7);
      *pcVar7 = (char)iVar5;
    }
  }
  else if (LVar1 == LOWER_CASE) {
    for (; pcVar7 < local_30; pcVar7 = pcVar7 + 1) {
      iVar5 = tolower((int)*pcVar7);
      *pcVar7 = (char)iVar5;
    }
  }
  return (local_5c - addr) + 2;
}

Assistant:

int
Moira::disassemble(char *str, u32 addr) const
{
    if constexpr (MOIRA_ENABLE_DASM == false) {
        throw std::runtime_error("This feature requires MOIRA_ENABLE_DASM = true\n");
    }

    u32 pc = addr;
    u16 opcode = read16Dasm(pc);

    StrWriter writer(str, instrStyle);

    (this->*dasm[opcode])(writer, pc, opcode);
    writer << Finish{};

    // Post process disassembler output
    switch (instrStyle.letterCase) {

        case LetterCase::MIXED_CASE:

            break;

        case LetterCase::LOWER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::tolower(*p));
            }
            break;

        case LetterCase::UPPER_CASE:

            for (auto p = writer.base; p < writer.ptr; p++) {
                *p = char(std::toupper(*p));
            }
            break;
    }

    return pc - addr + 2;
}